

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int tryCommand(char *aCommand)

{
  FILE *__stream;
  char *pcVar1;
  FILE *lIn;
  char lBuff [1024];
  char *aCommand_local;
  
  lBuff._1016_8_ = aCommand;
  __stream = popen(aCommand,"r");
  pcVar1 = fgets((char *)&lIn,0x400,__stream);
  if (pcVar1 != (char *)0x0) {
    pclose(__stream);
  }
  else {
    pclose(__stream);
  }
  aCommand_local._4_4_ = (uint)(pcVar1 == (char *)0x0);
  return aCommand_local._4_4_;
}

Assistant:

static int tryCommand( char const * const aCommand )
{
        char lBuff [MAX_PATH_OR_CMD] ;
        FILE * lIn ;

        lIn = popen( aCommand , "r" ) ;
        if ( fgets( lBuff , sizeof( lBuff ) , lIn ) == NULL )
        {       /* present */
                pclose( lIn ) ;
                return 1 ;
        }
        else
        {
                pclose( lIn ) ;
                return 0 ;
        }

}